

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilteredStorage.hpp
# Opt level: O0

void __thiscall
supermap::
FilteredStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_supermap::Key<3UL>,_supermap::FilteringRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_supermap::Key<3UL>_>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
::FilteredStorage(FilteredStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_supermap::Key<3UL>,_supermap::FilteringRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_supermap::Key<3UL>_>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
                  *this,SortedStorage *sortedStorage)

{
  SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>
  *in_RSI;
  SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>
  *in_RDI;
  
  SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>
  ::SortedSingleFileIndexedStorage(in_RSI,in_RDI);
  (in_RDI->
  super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
  ).
  super_IndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
  .
  super_OrderedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
  ._vptr_OrderedStorage = (_func_int **)&PTR_append_0038f0f0;
  (in_RDI->
  super_Findable<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_supermap::Key<3UL>_>).
  _vptr_Findable = (_func_int **)&DAT_0038f138;
  return;
}

Assistant:

explicit FilteredStorage(SortedStorage &&sortedStorage)
        : SortedSingleFileIndexedStorage<Content, IndexT, RegisterInfo, FindPattern>(std::move(sortedStorage)) {}